

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool packing_is_vec4_padded(BufferPackingStandard packing)

{
  bool local_9;
  BufferPackingStandard packing_local;
  
  if (((packing == BufferPackingStd140) || (packing == BufferPackingStd140EnhancedLayout)) ||
     (packing == BufferPackingHLSLCbuffer || packing == BufferPackingHLSLCbufferPackOffset)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool packing_is_vec4_padded(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingHLSLCbuffer:
	case BufferPackingHLSLCbufferPackOffset:
	case BufferPackingStd140:
	case BufferPackingStd140EnhancedLayout:
		return true;

	default:
		return false;
	}
}